

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O2

void VW::validate_version(vw *all)

{
  bool bVar1;
  ostream *poVar2;
  vw_exception *this;
  version_struct *this_00;
  string local_1e0;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  this_00 = &all->model_file_ver;
  bVar1 = version_struct::operator<(this_00,"7.6.0");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar2 = std::operator<<(&local_190,"Model has possibly incompatible version! ");
    version_struct::to_string_abi_cxx11_(&local_1e0,this_00);
    std::operator<<(poVar2,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/vw_validate.cc"
               ,0xf,&local_1c0);
    __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  bVar1 = version_struct::operator>(this_00,"8.6.1");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Warning: model version is more recent than VW version.  This may not work."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void validate_version(vw& all)
{
  if (all.model_file_ver < LAST_COMPATIBLE_VERSION)
    THROW("Model has possibly incompatible version! " << all.model_file_ver.to_string());
  if (all.model_file_ver > PACKAGE_VERSION)
    std::cerr << "Warning: model version is more recent than VW version.  This may not work." << std::endl;
}